

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O3

Gia_Man_t * Gia_ManReadGig(char *pFileName)

{
  int iVar1;
  FILE *__stream;
  Vec_Str_t *vLines;
  Gls_Man_t *p;
  Gia_Man_t *pGVar2;
  long lVar3;
  int level;
  long lVar4;
  timespec ts_1;
  int pCounts [11];
  timespec local_78;
  timespec local_68 [3];
  
  iVar1 = clock_gettime(3,local_68);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68[0].tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_68[0].tv_sec * -1000000;
  }
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pGVar2 = (Gia_Man_t *)0x0;
    printf("Cannot read file \"%s\".\n",pFileName);
  }
  else {
    vLines = Gls_ManCount((FILE *)__stream,(int *)local_68);
    rewind(__stream);
    lVar4 = 0;
    do {
      if (*(int *)((long)&local_68[0].tv_sec + lVar4) != 0) {
        printf("%s=%d  ",(long)&s_Strs_rel + (long)*(int *)((long)&s_Strs_rel + lVar4));
      }
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x2c);
    level = 3;
    iVar1 = clock_gettime(3,&local_78);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
    p = Gls_ManAlloc(vLines,(int *)local_68);
    Gls_ManParse((FILE *)__stream,p);
    pGVar2 = Gls_ManConstruct(p,pFileName);
    Gls_ManStop(p);
    fclose(__stream);
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManReadGig( char * pFileName )
{
    abctime clk = Abc_Clock();
    Gls_Man_t * p = NULL;
    Gia_Man_t * pGia = NULL;
    Vec_Str_t * vLines;
    int i, pCounts[GLS_FINAL];
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot read file \"%s\".\n", pFileName );
        return NULL;
    }
    vLines = Gls_ManCount( pFile, pCounts );
    rewind( pFile );
    // statistics
    for ( i = 0; i < GLS_FINAL; i++ )
        if ( pCounts[i] )
            printf( "%s=%d  ", s_Strs[i], pCounts[i] );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // collect data and derive AIG
    p = Gls_ManAlloc( vLines, pCounts );
    if ( Gls_ManParse( pFile, p ) )
        pGia = Gls_ManConstruct( p, pFileName );
    Gls_ManStop( p );
    fclose( pFile );
    //printf( "\n" );
    return pGia;
}